

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void __thiscall ClipperLib::Clipper::BuildIntersectList(Clipper *this,cInt topY)

{
  bool bVar1;
  cInt cVar2;
  TEdge *Edge1;
  TEdge *pTVar3;
  IntPoint local_48;
  IntersectNode *newNode;
  
  pTVar3 = *(TEdge **)
            (this->_vptr_Clipper[-3] + 0x10 +
            (long)&(this->m_Maxima).super__List_base<long_long,_std::allocator<long_long>_>);
  if (pTVar3 != (TEdge *)0x0) {
    this->m_SortedEdges = pTVar3;
    for (; pTVar3 != (TEdge *)0x0; pTVar3 = pTVar3->NextInAEL) {
      pTVar3->NextInSEL = pTVar3->NextInAEL;
      pTVar3->PrevInSEL = pTVar3->PrevInAEL;
      cVar2 = TopX(pTVar3,topY);
      (pTVar3->Curr).X = cVar2;
    }
    do {
      bVar1 = false;
      pTVar3 = this->m_SortedEdges;
      while (Edge1 = pTVar3, pTVar3 = Edge1->NextInSEL, pTVar3 != (TEdge *)0x0) {
        local_48.X = 0;
        local_48.Y = 0;
        if ((pTVar3->Curr).X < (Edge1->Curr).X) {
          IntersectPoint(Edge1,pTVar3,&local_48);
          if (local_48.Y < topY) {
            local_48.X = TopX(Edge1,topY);
            local_48.Y = topY;
          }
          newNode = (IntersectNode *)operator_new(0x20);
          newNode->Edge1 = Edge1;
          newNode->Edge2 = pTVar3;
          (newNode->Pt).X = local_48.X;
          (newNode->Pt).Y = local_48.Y;
          std::vector<ClipperLib::IntersectNode_*,_std::allocator<ClipperLib::IntersectNode_*>_>::
          push_back(&this->m_IntersectList,&newNode);
          SwapPositionsInSEL(this,Edge1,pTVar3);
          bVar1 = true;
          pTVar3 = Edge1;
        }
      }
    } while ((Edge1->PrevInSEL != (TEdge *)0x0) &&
            (Edge1->PrevInSEL->NextInSEL = (TEdge *)0x0, bVar1));
    this->m_SortedEdges = (TEdge *)0x0;
  }
  return;
}

Assistant:

void Clipper::BuildIntersectList(const cInt topY)
{
  if ( !m_ActiveEdges ) return;

  //prepare for sorting ...
  TEdge* e = m_ActiveEdges;
  m_SortedEdges = e;
  while( e )
  {
    e->PrevInSEL = e->PrevInAEL;
    e->NextInSEL = e->NextInAEL;
    e->Curr.X = TopX( *e, topY );
    e = e->NextInAEL;
  }

  //bubblesort ...
  bool isModified;
  do
  {
    isModified = false;
    e = m_SortedEdges;
    while( e->NextInSEL )
    {
      TEdge *eNext = e->NextInSEL;
      IntPoint Pt;
      if(e->Curr.X > eNext->Curr.X)
      {
        IntersectPoint(*e, *eNext, Pt);
        if (Pt.Y < topY) Pt = IntPoint(TopX(*e, topY), topY);
        IntersectNode * newNode = new IntersectNode;
        newNode->Edge1 = e;
        newNode->Edge2 = eNext;
        newNode->Pt = Pt;
        m_IntersectList.push_back(newNode);

        SwapPositionsInSEL(e, eNext);
        isModified = true;
      }
      else
        e = eNext;
    }
    if( e->PrevInSEL ) e->PrevInSEL->NextInSEL = 0;
    else break;
  }
  while ( isModified );
  m_SortedEdges = 0; //important
}